

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O0

UBool __thiscall icu_63::LocDataParser::checkInc(LocDataParser *this,UChar c)

{
  UChar c_local;
  LocDataParser *this_local;
  
  if ((this->p < this->e) && ((this->ch == c || (*this->p == c)))) {
    inc(this);
    this_local._7_1_ = '\x01';
  }
  else {
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

inline UBool checkInc(UChar c) {
        if (p < e && (ch == c || *p == c)) {
            inc();
            return TRUE;
        }
        return FALSE;
    }